

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

ostream * std::operator<<(ostream *ofs,Path *v)

{
  Path *in_RDX;
  string local_38;
  Path *local_18;
  Path *v_local;
  ostream *ofs_local;
  
  local_18 = v;
  v_local = (Path *)ofs;
  tinyusdz::(anonymous_namespace)::pquote_abi_cxx11_(&local_38,(_anonymous_namespace_ *)v,in_RDX);
  std::operator<<(ofs,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)v_local;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::Path &v) {
  ofs << tinyusdz::pquote(v);

  return ofs;
}